

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Throw.hpp
# Opt level: O3

bool __thiscall
ut11::Operands::WillThrow<minesweeper::InvalidInputException>::operator()
          (WillThrow<minesweeper::InvalidInputException> *this,function<void_()> *function)

{
  stringstream stream;
  
  if ((function->super__Function_base)._M_manager != (_Manager_type)0x0) {
    (*function->_M_invoker)((_Any_data *)function);
    return false;
  }
  std::__throw_bad_function_call();
}

Assistant:

inline bool operator()(std::function<void (void)> function) const
			{
				try
				{
					function();
				}
				catch(const Exception&)
				{
					return true;
				}
				catch(const std::exception& ex)
				{
					std::stringstream stream;
					stream << "Expected " << m_exceptionName << " to be thrown, but std::exception was thrown instead (what: " << ex.what() << ")";
					m_errorMessage = stream.str();
				}
				catch(...)
				{
					std::stringstream stream;
					stream << "Expected " << m_exceptionName << " to be thrown, but an unknown exception was thrown instead";
					m_errorMessage = stream.str();
				}
				return false;
			}